

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snapshot.cpp
# Opt level: O0

int __thiscall CSnapshotBuilder::Finish(CSnapshotBuilder *this,void *pSnapdata)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  int iVar6;
  CSnapshotItem *this_00;
  int *piVar7;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffef98;
  CSnapshot *in_stack_ffffffffffffefa0;
  int i_3;
  int OffsetCur;
  int i_2;
  bool Sorting;
  int i_1;
  int i;
  int NumItems;
  int KeySize;
  int OffsetSize;
  CSnapshot *pSnap;
  void *pSnapdata_local;
  CSnapshotBuilder *this_local;
  int aItemSizes [1024];
  
  aItemSizes[2] = 0;
  aItemSizes[3] = 0;
  lVar4 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = this->m_NumItems;
  iVar2 = this->m_NumItems;
  *(int *)pSnapdata = this->m_DataSize;
  *(int *)((long)pSnapdata + 4) = this->m_NumItems;
  iVar3 = this->m_NumItems;
  for (i = 0; i < iVar3; i = i + 1) {
    this_00 = GetItem(this,i);
    iVar6 = CSnapshotItem::Key(this_00);
    piVar7 = CSnapshot::SortedKeys((CSnapshot *)pSnapdata);
    piVar7[i] = iVar6;
  }
  for (i_1 = 0; i_1 < iVar3; i_1 = i_1 + 1) {
    if (i_1 < iVar3 + -1) {
      aItemSizes[i_1] = this->m_aOffsets[i_1 + 1] - this->m_aOffsets[i_1];
    }
    else {
      aItemSizes[i_1] = this->m_DataSize - this->m_aOffsets[i_1];
    }
  }
  bVar5 = true;
  while (bVar5) {
    bVar5 = false;
    for (i_2 = 1; i_2 < iVar3; i_2 = i_2 + 1) {
      piVar7 = CSnapshot::SortedKeys((CSnapshot *)pSnapdata);
      iVar6 = piVar7[i_2 + -1];
      piVar7 = CSnapshot::SortedKeys((CSnapshot *)pSnapdata);
      if (piVar7[i_2] < iVar6) {
        bVar5 = true;
        piVar7 = CSnapshot::SortedKeys((CSnapshot *)pSnapdata);
        in_stack_ffffffffffffefa0 = (CSnapshot *)(piVar7 + i_2);
        piVar7 = CSnapshot::SortedKeys((CSnapshot *)pSnapdata);
        std::swap<int>(&in_stack_ffffffffffffefa0->m_DataSize,piVar7 + (i_2 + -1));
        std::swap<int>(this->m_aOffsets + i_2,this->m_aOffsets + (i_2 + -1));
        std::swap<int>(aItemSizes + i_2,aItemSizes + (i_2 + -1));
      }
    }
  }
  OffsetCur = 0;
  for (i_3 = 0; i_3 < iVar3; i_3 = i_3 + 1) {
    iVar6 = OffsetCur;
    piVar7 = CSnapshot::Offsets(in_stack_ffffffffffffefa0);
    piVar7[i_3] = iVar6;
    CSnapshot::DataStart(in_stack_ffffffffffffefa0);
    mem_copy(in_stack_ffffffffffffefa0,(void *)CONCAT44(iVar6,in_stack_ffffffffffffef98),0);
    OffsetCur = aItemSizes[i_3] + OffsetCur;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar4) {
    __stack_chk_fail();
  }
  return this->m_DataSize + 8 + iVar2 * 4 + iVar1 * 4;
}

Assistant:

int CSnapshotBuilder::Finish(void *pSnapdata)
{
	// flattern and make the snapshot
	CSnapshot *pSnap = (CSnapshot *)pSnapdata;
	int OffsetSize = sizeof(int)*m_NumItems;
	int KeySize = sizeof(int)*m_NumItems;
	pSnap->m_DataSize = m_DataSize;
	pSnap->m_NumItems = m_NumItems;

	const int NumItems = m_NumItems;
	for(int i = 0; i < NumItems; i++)
	{
		pSnap->SortedKeys()[i] = GetItem(i)->Key();
	}

	// get full item sizes
	int aItemSizes[CSnapshotBuilder::MAX_ITEMS];

	for(int i = 0; i < NumItems; i++)
	{
		if(i < NumItems - 1)
		{
			aItemSizes[i] = m_aOffsets[i+1] - m_aOffsets[i];
		}
		else
		{
			aItemSizes[i] = m_DataSize - m_aOffsets[i];
		}
	}

	// bubble sort by keys
	bool Sorting = true;
	while(Sorting)
	{
		Sorting = false;

		for(int i = 1; i < NumItems; i++)
		{
			if(pSnap->SortedKeys()[i-1] > pSnap->SortedKeys()[i])
			{
				Sorting = true;
				std::swap(pSnap->SortedKeys()[i], pSnap->SortedKeys()[i-1]);
				std::swap(m_aOffsets[i], m_aOffsets[i-1]);
				std::swap(aItemSizes[i], aItemSizes[i-1]);
			}
		}
	}

	// copy sorted items
	int OffsetCur = 0;
	for(int i = 0; i < NumItems; i++)
	{
		pSnap->Offsets()[i] = OffsetCur;
		mem_copy(pSnap->DataStart()+OffsetCur, m_aData + m_aOffsets[i], aItemSizes[i]);
		OffsetCur += aItemSizes[i];
	}

	return sizeof(CSnapshot) + KeySize + OffsetSize + m_DataSize;
}